

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void sat_solver_restart(sat_solver *s)

{
  int **ppiVar1;
  veci *pvVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int in_R8D;
  clause *pcVar7;
  
  (s->Mem).nEntries[0] = 0;
  (s->Mem).nEntries[1] = 0;
  (s->Mem).iPage[0] = 0;
  (s->Mem).iPage[1] = 1;
  ppiVar1 = (s->Mem).pPages;
  **ppiVar1 = 2;
  *ppiVar1[1] = 2;
  s->hLearnts = -1;
  pcVar7 = (clause *)0x0;
  uVar3 = Sat_MemAppend(&s->Mem,(int *)0x0,2,0,in_R8D);
  s->hBinary = uVar3;
  if (uVar3 != 0) {
    uVar4 = (s->Mem).uPageMask & uVar3;
    if (uVar4 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    pcVar7 = (clause *)
             ((s->Mem).pPages[(int)uVar3 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar4);
  }
  s->binary = pcVar7;
  if ((-1 < (s->trail_lim).size) && ((s->trail_lim).size = 0, -1 < (s->order).size)) {
    (s->order).size = 0;
    if (0 < s->size) {
      uVar3 = s->size * 2;
      pvVar2 = s->wlists;
      uVar5 = 1;
      if (1 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&pvVar2->size + lVar6) = 0;
        lVar6 = lVar6 + 0x10;
      } while (uVar5 * 0x10 != lVar6);
    }
    s->nDBreduces = 0;
    s->size = 0;
    s->qhead = 0;
    s->qtail = 0;
    s->VarActType = 0;
    s->ClaActType = 0;
    s->var_inc = 0x20;
    s->var_decay = 0xffffffffffffffff;
    s->cla_inc = 0x800;
    s->cla_decay = 0xffffffff;
    if (-1 < (s->act_clas).size) {
      (s->act_clas).size = 0;
      s->root_level = 0;
      s->random_seed = 91648253.0;
      s->progress_estimate = 0.0;
      s->verbosity = 0;
      (s->stats).starts = 0;
      (s->stats).clauses = 0;
      (s->stats).learnts = 0;
      (s->stats).decisions = 0;
      (s->stats).propagations = 0;
      (s->stats).inspects = 0;
      (s->stats).conflicts = 0;
      (s->stats).clauses_literals = 0;
      (s->stats).learnts_literals = 0;
      (s->stats).tot_literals = 0;
      return;
    }
  }
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

void sat_solver_restart( sat_solver* s )
{
    int i;
    Sat_MemRestart( &s->Mem );
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    veci_resize(&s->trail_lim, 0);
    veci_resize(&s->order, 0);
    for ( i = 0; i < s->size*2; i++ )
        s->wlists[i].size = 0;

    s->nDBreduces = 0;

    // initialize other vars
    s->size                   = 0;
//    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;


    // variable activities
    solver_init_activities(s);
    veci_resize(&s->act_clas, 0);


    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = 91648253;
    s->progress_estimate      = 0;
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
}